

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b_rle.h
# Opt level: O0

uint32_t * __thiscall
FastPForLib::Simple8b_RLE<true>::decodeArray
          (Simple8b_RLE<true> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint32_t uVar1;
  NotEnoughStorage *this_00;
  ulong uVar2;
  uint32_t *in_RCX;
  uint *in_RSI;
  ulong *in_R8;
  uint32_t pos;
  uint64_t *in64;
  size_t actualvalue;
  uint32_t markednvalue;
  size_t in_stack_ffffffffffffff98;
  
  if (*in_R8 < (ulong)*in_RSI) {
    this_00 = (NotEnoughStorage *)__cxa_allocate_exception(0x18);
    NotEnoughStorage::NotEnoughStorage(this_00,in_stack_ffffffffffffff98);
    __cxa_throw(this_00,&NotEnoughStorage::typeinfo,NotEnoughStorage::~NotEnoughStorage);
  }
  uVar2 = (ulong)*in_RSI;
  if (*in_R8 < uVar2) {
    fprintf(_stderr,"possible overrun\n");
  }
  *in_R8 = uVar2;
  uVar1 = Simple8b_Codec::Decompress((uint64_t *)(in_RSI + 1),0,in_RCX,0,(uint32_t)*in_R8);
  *in_R8 = uVar2;
  return (uint32_t *)(uint64_t *)((long)(in_RSI + 1) + (ulong)uVar1 * 8);
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t length,
                              uint32_t *out, size_t &nvalue) {
    (void)length;

    uint32_t markednvalue;
    if (MarkLength) {
      markednvalue = *in++;
      if (markednvalue > nvalue)
        throw NotEnoughStorage(markednvalue);
    }
    const size_t actualvalue = MarkLength ? markednvalue : nvalue;
    // this may lead to unaligned access. Performance may be affected.
    // not much of an effect in practice on recent Intel processors.
    const uint64_t *in64 = reinterpret_cast<const uint64_t *>(in);
#ifndef NDEBUG
    const uint32_t *const endin(in + length);
    const uint64_t *finalin64 = reinterpret_cast<const uint64_t *>(endin);
#endif
    if (nvalue < actualvalue) {
      fprintf(stderr, "possible overrun\n");
    }
    nvalue = actualvalue;

    uint32_t pos = 0;

    pos = Simple8b_Codec::Decompress(in64, 0, out, 0, uint32_t(nvalue));

    assert(in64 + pos <= finalin64);
    in = reinterpret_cast<const uint32_t *>(in64 + pos);
    assert(in <= endin);
    nvalue = MarkLength ? actualvalue : nvalue;
    return in;
  }